

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlFileRead(void)

{
  int iVar1;
  int iVar2;
  int val;
  void *val_00;
  int local_3c;
  int n_len;
  int len;
  int n_buffer;
  char *buffer;
  int n_context;
  void *context;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (buffer._4_4_ = 0; (int)buffer._4_4_ < 2; buffer._4_4_ = buffer._4_4_ + 1) {
    for (n_len = 0; n_len < 1; n_len = n_len + 1) {
      for (local_3c = 0; local_3c < 4; local_3c = local_3c + 1) {
        iVar1 = xmlMemBlocks();
        val_00 = gen_void_ptr(buffer._4_4_,0);
        iVar2 = gen_int(local_3c,2);
        val = xmlFileRead(val_00,0,iVar2);
        desret_int(val);
        call_tests = call_tests + 1;
        des_void_ptr(buffer._4_4_,val_00,0);
        des_int(local_3c,iVar2,2);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlFileRead",(ulong)(uint)(iVar2 - iVar1));
          ret_val = ret_val + 1;
          printf(" %d",(ulong)buffer._4_4_);
          printf(" %d",(ulong)(uint)n_len);
          printf(" %d");
          printf("\n");
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlFileRead(void) {
    int test_ret = 0;

    int mem_base;
    int ret_val;
    void * context; /* the I/O context */
    int n_context;
    char * buffer; /* where to drop data */
    int n_buffer;
    int len; /* number of bytes to write */
    int n_len;

    for (n_context = 0;n_context < gen_nb_void_ptr;n_context++) {
    for (n_buffer = 0;n_buffer < gen_nb_char_ptr;n_buffer++) {
    for (n_len = 0;n_len < gen_nb_int;n_len++) {
        mem_base = xmlMemBlocks();
        context = gen_void_ptr(n_context, 0);
        buffer = gen_char_ptr(n_buffer, 1);
        len = gen_int(n_len, 2);

        ret_val = xmlFileRead(context, buffer, len);
        desret_int(ret_val);
        call_tests++;
        des_void_ptr(n_context, context, 0);
        des_char_ptr(n_buffer, buffer, 1);
        des_int(n_len, len, 2);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlFileRead",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_context);
            printf(" %d", n_buffer);
            printf(" %d", n_len);
            printf("\n");
        }
    }
    }
    }
    function_tests++;

    return(test_ret);
}